

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

bool __thiscall LLVMBC::ModuleParseContext::resolve_forward_references(ModuleParseContext *this)

{
  pointer ppVVar1;
  pointer ppBVar2;
  BasicBlock *this_00;
  bool bVar3;
  __normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
  _Var4;
  IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
  IVar5;
  pointer ppBVar6;
  pointer ppVVar7;
  
  ppVVar7 = (this->pending_forward_references).
            super__Vector_base<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVVar1 = (this->pending_forward_references).
            super__Vector_base<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVVar7 != ppVVar1) {
    do {
      bVar3 = ValueProxy::resolve(*ppVVar7);
      if (!bVar3) {
        return false;
      }
      ppVVar7 = ppVVar7 + 1;
    } while (ppVVar7 != ppVVar1);
    ppVVar7 = (this->pending_forward_references).
              super__Vector_base<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->pending_forward_references).
        super__Vector_base<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVVar7) {
      (this->pending_forward_references).
      super__Vector_base<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVVar7;
    }
  }
  ppBVar6 = (this->basic_blocks).
            super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppBVar2 = (this->basic_blocks).
            super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppBVar6 == ppBVar2) {
      return true;
    }
    this_00 = *ppBVar6;
    _Var4._M_current = (Instruction **)BasicBlock::begin(this_00);
    IVar5 = BasicBlock::end(this_00);
    for (; (__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
            )_Var4._M_current != IVar5.iter._M_current; _Var4._M_current = _Var4._M_current + 1) {
      bVar3 = Instruction::resolve_proxy_values(*_Var4._M_current);
      if (!bVar3) {
        return false;
      }
    }
    ppBVar6 = ppBVar6 + 1;
  } while( true );
}

Assistant:

bool ModuleParseContext::resolve_forward_references()
{
	for (auto *ref : pending_forward_references)
		if (!ref->resolve())
			return false;
	pending_forward_references.clear();

	for (auto *bb : basic_blocks)
		for (auto &inst : *bb)
			if (!inst.resolve_proxy_values())
				return false;

	return true;
}